

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPT.cpp
# Opt level: O0

void __thiscall OpenMD::NPT::NPT(NPT *this,SimInfo *info)

{
  bool bVar1;
  SnapshotManager *this_00;
  undefined8 *in_RDI;
  RealType RVar2;
  Snapshot *currSnapshot;
  Globals *simParams;
  SimInfo *in_stack_fffffffffffffe98;
  Snapshot *in_stack_fffffffffffffea0;
  
  VelocityVerletIntegrator::VelocityVerletIntegrator
            ((VelocityVerletIntegrator *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  *in_RDI = &PTR__NPT_00501f18;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x2108da)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x2108f6)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x210912)
  ;
  in_RDI[0x33] = 0x3eb0c6f7a0b5ed8d;
  std::pair<double,_double>::pair<double,_double,_true>((pair<double,_double> *)(in_RDI + 0x34));
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x210955);
  in_RDI[0x3f] = 0x3eb0c6f7a0b5ed8d;
  *(undefined4 *)(in_RDI + 0x40) = 4;
  SimInfo::getSimParams((SimInfo *)in_RDI[0xe]);
  bVar1 = Globals::getUseIntialExtendedSystemState((Globals *)0x2109aa);
  if (!bVar1) {
    this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[0xe]);
    SnapshotManager::getCurrentSnapshot(this_00);
    std::make_pair<double,double>
              ((double *)in_stack_fffffffffffffea0,(double *)in_stack_fffffffffffffe98);
    Snapshot::setThermostat
              (in_stack_fffffffffffffea0,(pair<double,_double> *)in_stack_fffffffffffffe98);
    SquareMatrix3<double>::SquareMatrix3
              ((SquareMatrix3<double> *)in_stack_fffffffffffffea0,(double)in_stack_fffffffffffffe98)
    ;
    Snapshot::setBarostat(in_stack_fffffffffffffea0,(Mat3x3d *)in_stack_fffffffffffffe98);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x210ac6);
  }
  bVar1 = Globals::haveTargetTemp((Globals *)0x210b2d);
  if (bVar1) {
    RVar2 = Globals::getTargetTemp((Globals *)0x210b8b);
    in_RDI[0x26] = RVar2;
  }
  else {
    snprintf(painCave.errMsg,2000,"You can\'t use the NVT integrator without a targetTemp!\n");
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  bVar1 = Globals::haveTauThermostat((Globals *)0x210bb6);
  if (bVar1) {
    RVar2 = Globals::getTauThermostat((Globals *)0x210c14);
    in_RDI[0x28] = RVar2;
  }
  else {
    snprintf(painCave.errMsg,2000,
             "If you use the constant temperature\n\tintegrator, you must set tauThermostat.\n");
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  bVar1 = Globals::haveTargetPressure((Globals *)0x210c3f);
  if (bVar1) {
    RVar2 = Globals::getTargetPressure((Globals *)0x210c93);
    in_RDI[0x27] = RVar2;
  }
  else {
    snprintf(painCave.errMsg,2000,
             "NPT error: You can\'t use the NPT integrator\n   without a targetPressure!\n");
    painCave.isFatal = 1;
    simError();
  }
  bVar1 = Globals::haveTauBarostat((Globals *)0x210cbe);
  if (bVar1) {
    in_stack_fffffffffffffea0 = (Snapshot *)Globals::getTauBarostat((Globals *)0x210d1c);
    in_RDI[0x29] = in_stack_fffffffffffffea0;
  }
  else {
    snprintf(painCave.errMsg,2000,"If you use the NPT integrator, you must set tauBarostat.\n");
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  in_RDI[0x21] = (double)in_RDI[0x28] * (double)in_RDI[0x28];
  in_RDI[0x22] = (double)in_RDI[0x29] * (double)in_RDI[0x29];
  Integrator::updateSizes((Integrator *)in_stack_fffffffffffffea0);
  return;
}

Assistant:

NPT::NPT(SimInfo* info) :
      VelocityVerletIntegrator(info), etaTolerance(1e-6), chiTolerance(1e-6),
      maxIterNum_(4) {
    Globals* simParams = info_->getSimParams();

    if (!simParams->getUseIntialExtendedSystemState()) {
      Snapshot* currSnapshot =
          info_->getSnapshotManager()->getCurrentSnapshot();
      currSnapshot->setThermostat(make_pair(0.0, 0.0));
      currSnapshot->setBarostat(Mat3x3d(0.0));
    }

    if (!simParams->haveTargetTemp()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "You can't use the NVT integrator without a targetTemp!\n");
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    } else {
      targetTemp = simParams->getTargetTemp();
    }

    // We must set tauThermostat
    if (!simParams->haveTauThermostat()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "If you use the constant temperature\n"
               "\tintegrator, you must set tauThermostat.\n");

      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    } else {
      tauThermostat = simParams->getTauThermostat();
    }

    if (!simParams->haveTargetPressure()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NPT error: You can't use the NPT integrator\n"
               "   without a targetPressure!\n");

      painCave.isFatal = 1;
      simError();
    } else {
      targetPressure = simParams->getTargetPressure();
    }

    if (!simParams->haveTauBarostat()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "If you use the NPT integrator, you must set tauBarostat.\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    } else {
      tauBarostat = simParams->getTauBarostat();
    }

    tt2 = tauThermostat * tauThermostat;
    tb2 = tauBarostat * tauBarostat;

    updateSizes();
  }